

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_> *
__thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
          (RepeatedPtrFieldBase *this,int index)

{
  Nonnull<const_char_*> failure_msg;
  void **ppvVar1;
  int line;
  LogMessageFatal local_20;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(index,0,"index >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_LTImpl
                            (index,this->current_size_,"index < current_size_");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      ppvVar1 = element_at(this,index);
      return (Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
              *)*ppvVar1;
    }
    line = 0xcd;
  }
  else {
    line = 0xcc;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    if constexpr (GetBoundsCheckMode() == BoundsCheckMode::kAbort) {
      RuntimeAssertInBounds(index, current_size_);
    } else {
      ABSL_DCHECK_GE(index, 0);
      ABSL_DCHECK_LT(index, current_size_);
    }
    return cast<TypeHandler>(element_at(index));
  }